

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  char *z;
  undefined1 uVar13;
  ulong uVar14;
  int iVar15;
  long in_FS_OFFSET;
  undefined1 local_78 [12];
  int iStack_6c;
  undefined8 local_68;
  undefined1 *puStack_60;
  double local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 *puStack_30;
  long local_20;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = -NAN;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  iVar11 = isDate(context,argc,argv,(DateTime *)local_78);
  if (iVar11 == 0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    computeYMD_HMS((DateTime *)local_78);
    uVar9 = -local_78._8_4_;
    if (0 < (int)local_78._8_4_) {
      uVar9 = local_78._8_4_;
    }
    uVar14 = (ulong)uVar9;
    uVar1 = (uVar14 / 10) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar14 / 1000) % 10;
    uVar8 = (ushort)uVar3;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar1;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)(uVar14 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar14 % 10) - (0xff < uVar8);
    local_48 = (undefined1 *)
               CONCAT17((char)(iStack_6c % 10) + '0',
                        CONCAT16((char)((long)((ulong)(uint)((int)((long)iStack_6c / 10) >> 0x1f) <<
                                               0x20 | (long)iStack_6c / 10 & 0xffffffffU) % 10) +
                                 '0',CONCAT15(0x2d,CONCAT41(CONCAT13((bVar7 != 0) * (bVar7 < 0x100)
                                                                     * bVar7 - (0xff < bVar7),
                                                                     CONCAT12((bVar6 != 0) *
                                                                              (bVar6 < 0x100) *
                                                                              bVar6 - (0xff < bVar6)
                                                                              ,CONCAT11((bVar5 != 0)
                                                                                        * (bVar5 < 
                                                  0x100) * bVar5 - (0xff < bVar5),
                                                  (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                  (0xff < bVar4)))) | (uint)DAT_001eaf30,
                                                  (char)local_48))));
    uStack_40 = (undefined1 *)
                CONCAT17((char)((long)((ulong)(uint)((int)((long)(int)puStack_60 / 10) >> 0x1f) <<
                                       0x20 | (long)(int)puStack_60 / 10 & 0xffffffffU) % 10) + '0',
                         CONCAT16(0x3a,CONCAT15((char)(local_68._4_4_ % 10) + '0',
                                                CONCAT14((char)((long)((ulong)(uint)((int)((long)
                                                  local_68._4_4_ / 10) >> 0x1f) << 0x20 |
                                                  (long)local_68._4_4_ / 10 & 0xffffffffU) % 10) +
                                                  '0',CONCAT13(0x20,CONCAT12((char)((int)local_68 %
                                                                                   10) + '0',
                                                                             CONCAT11((char)((long)(
                                                  (ulong)(uint)((int)((long)(int)local_68 / 10) >>
                                                               0x1f) << 0x20 |
                                                  (long)(int)local_68 / 10 & 0xffffffffU) % 10) +
                                                  '0',0x2d)))))));
    local_38._0_2_ = CONCAT11(0x3a,(char)((int)puStack_60 % 10) + '0');
    if (((ulong)local_50 & 0x400000000) == 0) {
      iVar12 = (int)local_58;
      iVar11 = iVar12 / 10;
      iVar15 = 0x14;
      uVar13 = 0;
    }
    else {
      iVar15 = (int)(local_58 * 1000.0 + 0.5);
      iVar11 = iVar15 / 10000;
      iVar12 = iVar15 / 1000;
      local_38 = (undefined1 *)
                 CONCAT17((char)(iVar15 % 10) + '0',
                          CONCAT16((char)((long)((ulong)(uint)((int)((long)iVar15 / 10) >> 0x1f) <<
                                                 0x20 | (long)iVar15 / 10 & 0xffffffffU) % 10) + '0'
                                   ,CONCAT15((char)((long)((ulong)(uint)((int)((long)iVar15 / 100)
                                                                        >> 0x1f) << 0x20 |
                                                          (long)iVar15 / 100 & 0xffffffffU) % 10) +
                                             '0',(undefined5)local_38)));
      puStack_30 = (undefined1 *)((ulong)puStack_30 & 0xffffffffffffff00);
      iVar15 = 0x18;
      uVar13 = 0x2e;
    }
    uVar10 = local_38;
    local_38._5_3_ = SUB83(uVar10,5);
    local_38._0_5_ =
         CONCAT14(uVar13,CONCAT13((char)(iVar12 % 10) + '0',
                                  CONCAT12((char)(iVar11 % 10) + '0',(undefined2)local_38)));
    if ((int)local_78._8_4_ < 0) {
      z = (char *)&local_48;
      local_48 = (undefined1 *)CONCAT71(local_48._1_7_,0x2d);
    }
    else {
      z = (char *)((long)&local_48 + 1);
      iVar15 = iVar15 + -1;
    }
    sqlite3_result_text(context,z,iVar15,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}